

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_stbvorbis_get_length_in_pcm_frames(ma_stbvorbis *pVorbis,ma_uint64 *pLength)

{
  uint uVar1;
  ulong uVar2;
  ma_result mVar3;
  
  mVar3 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pVorbis != (ma_stbvorbis *)0x0)) {
    mVar3 = MA_SUCCESS;
    if (pVorbis->usingPushMode == 0) {
      uVar1 = stb_vorbis_stream_length_in_samples(pVorbis->stb);
      uVar2 = (ulong)uVar1;
    }
    else {
      uVar2 = 0;
    }
    *pLength = uVar2;
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_stbvorbis_get_length_in_pcm_frames(ma_stbvorbis* pVorbis, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        if (pVorbis->usingPushMode) {
            *pLength = 0;   /* I don't know of a good way to determine this reliably with stb_vorbis and push mode. */
        } else {
            *pLength = stb_vorbis_stream_length_in_samples(pVorbis->stb);
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}